

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O3

ReadFileResult
anon_unknown.dwarf_d21b74::SubConditionHelper
          (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
           *out,Value *value)

{
  _Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false> _Var1;
  ReadFileResult RVar2;
  int iVar3;
  _Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false> _Var4;
  _Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false> local_20;
  
  local_20._M_head_impl = (Condition *)0x0;
  RVar2 = ConditionHelper((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           *)&local_20,value);
  _Var1._M_head_impl = local_20._M_head_impl;
  if ((local_20._M_head_impl == (Condition *)0x0) ||
     (iVar3 = (*(local_20._M_head_impl)->_vptr_Condition[3])(local_20._M_head_impl),
     (char)iVar3 == '\0')) {
    _Var4._M_head_impl =
         (out->_M_t).
         super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
         ._M_t.
         super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
         .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
    (out->_M_t).
    super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
         _Var1._M_head_impl;
    if (_Var4._M_head_impl == (Condition *)0x0) {
      return RVar2;
    }
  }
  else {
    RVar2 = INVALID_CONDITION;
    _Var4._M_head_impl = _Var1._M_head_impl;
  }
  (*(_Var4._M_head_impl)->_vptr_Condition[1])(_Var4._M_head_impl);
  return RVar2;
}

Assistant:

ReadFileResult SubConditionHelper(
  std::unique_ptr<cmCMakePresetsGraph::Condition>& out,
  const Json::Value* value)
{
  std::unique_ptr<cmCMakePresetsGraph::Condition> ptr;
  auto result = ConditionHelper(ptr, value);
  if (ptr && ptr->IsNull()) {
    return ReadFileResult::INVALID_CONDITION;
  }
  out = std::move(ptr);
  return result;
}